

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLog.cpp
# Opt level: O0

void __thiscall SocketLog::startSendThread(SocketLog *this)

{
  thread *this_00;
  type local_18;
  SocketLog *local_10;
  SocketLog *this_local;
  
  local_10 = this;
  this_00 = (thread *)operator_new(8);
  local_18.this = this;
  std::thread::thread<SocketLog::startSendThread()::__0,,void>(this_00,&local_18);
  return;
}

Assistant:

void SocketLog::startSendThread() {
    new std::thread([this]{
        LOGD("sendThread running...");
        std::string msg;

        while (true) {
            {
                std::unique_lock<std::mutex> lock(msgQueueMutex);
                LOGD("msgQueue.size=%ld, msgQueueCondition will %s", msgQueue.size(),
                     msgQueue.empty() ? "waiting..." : "not wait!");
                msgQueueCondition.wait(lock, [this] { return !msgQueue.empty(); });
                LOGD("msgQueueCondition wake! msgQueue.size=%ld", msgQueue.size());

                msg = std::move(msgQueue.front());
                msgQueue.pop();
            }

            send(msg);
        }
    });
}